

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O3

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  
  iVar1 = bottom_top_blob->dims;
  if (iVar1 == 3) {
    uVar2 = bottom_top_blob->w;
    uVar11 = (ulong)uVar2;
    uVar9 = bottom_top_blob->h;
    uVar4 = bottom_top_blob->c;
    if (this->affine_size == uVar2) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      iVar1 = bottom_top_blob->w;
      pvVar14 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->elemsize;
      iVar3 = this->affine;
      sVar6 = bottom_top_blob->cstep;
      uVar13 = 0;
      do {
        if (0 < (int)uVar9) {
          pvVar7 = (this->gamma_data).data;
          pvVar8 = (this->beta_data).data;
          uVar15 = 0;
          pvVar17 = pvVar14;
          do {
            fVar18 = 0.0;
            if ((int)uVar2 < 1) {
LAB_004d65da:
              fVar20 = 0.0;
            }
            else {
              uVar16 = 0;
              do {
                fVar18 = fVar18 + *(float *)((long)pvVar17 + uVar16 * 4);
                uVar16 = uVar16 + 1;
              } while (uVar11 != uVar16);
              fVar18 = fVar18 * (1.0 / (float)(int)uVar2);
              if ((int)uVar2 < 1) goto LAB_004d65da;
              fVar20 = 0.0;
              uVar16 = 0;
              do {
                fVar21 = *(float *)((long)pvVar17 + uVar16 * 4) - fVar18;
                fVar20 = fVar20 + fVar21 * fVar21;
                uVar16 = uVar16 + 1;
              } while (uVar11 != uVar16);
            }
            fVar21 = fVar20 * (1.0 / (float)(int)uVar2) + this->eps;
            auVar19 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar21));
            fVar20 = auVar19._0_4_;
            fVar20 = fVar20 * -0.5 * (fVar21 * fVar20 * fVar20 + -3.0);
            if (iVar3 == 0) {
              if (0 < (int)uVar2) {
                uVar16 = 0;
                do {
                  *(float *)((long)pvVar17 + uVar16 * 4) =
                       *(float *)((long)pvVar17 + uVar16 * 4) * fVar20 + -fVar18 * fVar20;
                  uVar16 = uVar16 + 1;
                } while (uVar11 != uVar16);
              }
            }
            else if (0 < (int)uVar2) {
              uVar16 = 0;
              do {
                *(float *)((long)pvVar17 + uVar16 * 4) =
                     (*(float *)((long)pvVar17 + uVar16 * 4) * fVar20 + -fVar18 * fVar20) *
                     *(float *)((long)pvVar7 + uVar16 * 4) + *(float *)((long)pvVar8 + uVar16 * 4);
                uVar16 = uVar16 + 1;
              } while (uVar11 != uVar16);
            }
            uVar15 = uVar15 + 1;
            pvVar17 = (void *)((long)pvVar17 + (long)iVar1 * sVar5);
          } while (uVar15 != uVar9);
        }
        uVar13 = uVar13 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar6 * sVar5);
        if (uVar13 == uVar4) {
          return 0;
        }
      } while( true );
    }
    if ((int)uVar4 < 1) {
      return 0;
    }
    uVar9 = uVar9 * uVar2;
    pvVar14 = bottom_top_blob->data;
    sVar5 = bottom_top_blob->cstep;
    iVar1 = this->affine;
    pvVar7 = (this->gamma_data).data;
    pvVar8 = (this->beta_data).data;
    uVar11 = (ulong)uVar9;
    sVar6 = bottom_top_blob->elemsize;
    uVar13 = 0;
    do {
      fVar18 = 0.0;
      if ((int)uVar9 < 1) {
LAB_004d6720:
        fVar20 = 0.0;
      }
      else {
        uVar15 = 0;
        do {
          fVar18 = fVar18 + *(float *)((long)pvVar14 + uVar15 * 4);
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
        fVar18 = fVar18 * (1.0 / (float)(int)uVar9);
        if ((int)uVar9 < 1) goto LAB_004d6720;
        fVar20 = 0.0;
        uVar15 = 0;
        do {
          fVar21 = *(float *)((long)pvVar14 + uVar15 * 4) - fVar18;
          fVar20 = fVar20 + fVar21 * fVar21;
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
      }
      fVar21 = fVar20 * (1.0 / (float)(int)uVar9) + this->eps;
      auVar19 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar21));
      fVar20 = auVar19._0_4_;
      fVar20 = fVar20 * -0.5 * (fVar21 * fVar20 * fVar20 + -3.0);
      if (iVar1 == 0) {
        if (0 < (int)uVar9) {
          uVar15 = 0;
          do {
            *(float *)((long)pvVar14 + uVar15 * 4) =
                 *(float *)((long)pvVar14 + uVar15 * 4) * fVar20 + -fVar18 * fVar20;
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
      }
      else if (0 < (int)uVar9) {
        uVar15 = 0;
        do {
          *(float *)((long)pvVar14 + uVar15 * 4) =
               (*(float *)((long)pvVar14 + uVar15 * 4) * fVar20 + -fVar18 * fVar20) *
               *(float *)((long)pvVar7 + uVar15 * 4) + *(float *)((long)pvVar8 + uVar15 * 4);
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
      }
      uVar13 = uVar13 + 1;
      pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
      if (uVar13 == uVar4) {
        return 0;
      }
    } while( true );
  }
  if (iVar1 == 2) {
    iVar1 = bottom_top_blob->h;
    if ((long)iVar1 < 1) {
      return 0;
    }
    uVar2 = bottom_top_blob->w;
    uVar11 = (ulong)uVar2;
    pvVar14 = bottom_top_blob->data;
    iVar3 = this->affine;
    pvVar7 = (this->gamma_data).data;
    pvVar8 = (this->beta_data).data;
    sVar5 = bottom_top_blob->elemsize;
    lVar10 = 0;
    do {
      fVar18 = 0.0;
      if ((int)uVar2 < 1) {
LAB_004d647b:
        fVar20 = 0.0;
      }
      else {
        uVar13 = 0;
        do {
          fVar18 = fVar18 + *(float *)((long)pvVar14 + uVar13 * 4);
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
        fVar18 = fVar18 * (1.0 / (float)(int)uVar2);
        if ((int)uVar2 < 1) goto LAB_004d647b;
        fVar20 = 0.0;
        uVar13 = 0;
        do {
          fVar21 = *(float *)((long)pvVar14 + uVar13 * 4) - fVar18;
          fVar20 = fVar20 + fVar21 * fVar21;
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
      }
      fVar21 = fVar20 * (1.0 / (float)(int)uVar2) + this->eps;
      auVar19 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar21));
      fVar20 = auVar19._0_4_;
      fVar20 = fVar20 * -0.5 * (fVar21 * fVar20 * fVar20 + -3.0);
      if (iVar3 == 0) {
        if (0 < (int)uVar2) {
          uVar13 = 0;
          do {
            *(float *)((long)pvVar14 + uVar13 * 4) =
                 *(float *)((long)pvVar14 + uVar13 * 4) * fVar20 + -fVar18 * fVar20;
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
      }
      else if (0 < (int)uVar2) {
        uVar13 = 0;
        do {
          *(float *)((long)pvVar14 + uVar13 * 4) =
               (*(float *)((long)pvVar14 + uVar13 * 4) * fVar20 + -fVar18 * fVar20) *
               *(float *)((long)pvVar7 + uVar13 * 4) + *(float *)((long)pvVar8 + uVar13 * 4);
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
      }
      lVar10 = lVar10 + 1;
      pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar2 * sVar5);
      if (lVar10 == iVar1) {
        return 0;
      }
    } while( true );
  }
  if (iVar1 != 1) {
    return 0;
  }
  iVar1 = bottom_top_blob->w;
  lVar10 = (long)iVar1;
  pvVar14 = bottom_top_blob->data;
  if (lVar10 < 1) {
    fVar18 = 0.0;
  }
  else {
    fVar18 = 0.0;
    lVar12 = 0;
    do {
      fVar18 = fVar18 + *(float *)((long)pvVar14 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar10 != lVar12);
    fVar18 = fVar18 / (float)iVar1;
    if (0 < iVar1) {
      fVar20 = 0.0;
      lVar12 = 0;
      do {
        fVar21 = *(float *)((long)pvVar14 + lVar12 * 4) - fVar18;
        fVar20 = fVar20 + fVar21 * fVar21;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
      goto LAB_004d67c8;
    }
  }
  fVar20 = 0.0;
LAB_004d67c8:
  fVar21 = fVar20 / (float)iVar1 + this->eps;
  auVar19._0_12_ = ZEXT812(0);
  auVar19._12_4_ = 0;
  auVar19 = rsqrtss(auVar19,ZEXT416((uint)fVar21));
  fVar20 = auVar19._0_4_;
  fVar20 = fVar20 * -0.5 * (fVar21 * fVar20 * fVar20 + -3.0);
  if (this->affine == 0) {
    if (0 < iVar1) {
      lVar12 = 0;
      do {
        *(float *)((long)pvVar14 + lVar12 * 4) =
             *(float *)((long)pvVar14 + lVar12 * 4) * fVar20 + -fVar18 * fVar20;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
  }
  else if (0 < iVar1) {
    pvVar7 = (this->gamma_data).data;
    pvVar8 = (this->beta_data).data;
    lVar12 = 0;
    do {
      *(float *)((long)pvVar14 + lVar12 * 4) =
           (*(float *)((long)pvVar14 + lVar12 * 4) * fVar20 + -fVar18 * fVar20) *
           *(float *)((long)pvVar7 + lVar12 * 4) + *(float *)((long)pvVar8 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar10 != lVar12);
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / w;
        float tmp = 0.f;
        for (int i = 0; i < w; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / w;
        // the var maybe minus due to accuracy
        //float var = sqsum / w - mean * mean;

        float a = 1.f / (sqrtf(var + eps));
        float b = -mean * a;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = 1.f / (sqrtf(var + eps));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    // mean and var
                    float sum = 0.f;
                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sum += ptr[j];
                        //sqsum += ptr[j] * ptr[j];
                    }
                    float mean = sum / w;
                    float tmp = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        tmp = ptr[j] - mean;
                        sqsum += tmp * tmp;
                    }
                    float var = sqsum / w;
                    // the var maybe minus due to accuracy
                    //float var = sqsum / w - mean * mean;

                    float a = 1.f / (sqrtf(var + eps));
                    float b = -mean * a;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a + b;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                // mean and var
                float sum = 0.f;
                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                    //sqsum += ptr[i] * ptr[i];
                }
                float mean = sum / size;
                float tmp = 0.f;
                for (int i = 0; i < size; i++)
                {
                    tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
                float var = sqsum / size;
                // the var maybe minus due to accuracy
                //float var = sqsum / size - mean * mean;

                float a = 1.f / (sqrtf(var + eps));
                float b = -mean * a;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a + b;
                    }
                }
            }
        }
    }

    return 0;
}